

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int biseqcaseless(bstring b0,bstring b1)

{
  int iVar1;
  uchar *puVar2;
  uchar *puVar3;
  __int32_t **pp_Var4;
  int iVar5;
  byte bVar6;
  byte bVar7;
  long lVar8;
  
  iVar5 = -1;
  if ((b0 != (bstring)0x0) && (puVar2 = b0->data, puVar2 != (uchar *)0x0)) {
    iVar1 = b0->slen;
    if ((b1 != (bstring)0x0 && -1 < (long)iVar1) &&
       ((puVar3 = b1->data, puVar3 != (uchar *)0x0 && (-1 < b1->slen)))) {
      if (iVar1 == b1->slen) {
        iVar5 = 1;
        if (iVar1 != 0 && puVar2 != puVar3) {
          for (lVar8 = 0; iVar1 != lVar8; lVar8 = lVar8 + 1) {
            bVar6 = puVar2[lVar8];
            bVar7 = puVar3[lVar8];
            if (bVar6 != bVar7) {
              if (-1 < (char)bVar6) {
                pp_Var4 = __ctype_tolower_loc();
                bVar6 = *(byte *)(*pp_Var4 + bVar6);
              }
              if (-1 < (char)bVar7) {
                pp_Var4 = __ctype_tolower_loc();
                bVar7 = *(byte *)(*pp_Var4 + bVar7);
              }
              if (bVar6 != bVar7) goto LAB_0010f698;
            }
          }
        }
      }
      else {
LAB_0010f698:
        iVar5 = 0;
      }
    }
  }
  return iVar5;
}

Assistant:

int biseqcaseless (const bstring b0, const bstring b1) {
int i, n;

	if (bdata (b0) == NULL || b0->slen < 0 || 
	    bdata (b1) == NULL || b1->slen < 0) return BSTR_ERR;
	if (b0->slen != b1->slen) return 0;
	if (b0->data == b1->data || b0->slen == 0) return 1;
	for (i=0, n=b0->slen; i < n; i++) {
		if (b0->data[i] != b1->data[i]) {
			unsigned char c = (unsigned char) downcase (b0->data[i]);
			if (c != (unsigned char) downcase (b1->data[i])) return 0;
		}
	}
	return 1;
}